

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

xmlParserInputBufferPtr xmlAllocParserInputBuffer(xmlCharEncoding enc)

{
  int *piVar1;
  xmlBufPtr pxVar2;
  xmlCharEncodingHandlerPtr pxVar3;
  xmlParserInputBufferPtr ret;
  xmlParserInputBufferPtr pxStack_10;
  xmlCharEncoding enc_local;
  
  pxStack_10 = (xmlParserInputBufferPtr)(*xmlMalloc)(0x40);
  if (pxStack_10 == (xmlParserInputBufferPtr)0x0) {
    xmlIOErrMemory("creating input buffer");
    pxStack_10 = (xmlParserInputBufferPtr)0x0;
  }
  else {
    memset(pxStack_10,0,0x40);
    piVar1 = __xmlDefaultBufferSize();
    pxVar2 = xmlBufCreateSize((long)(*piVar1 << 1));
    pxStack_10->buffer = pxVar2;
    if (pxStack_10->buffer == (xmlBufPtr)0x0) {
      (*xmlFree)(pxStack_10);
      pxStack_10 = (xmlParserInputBufferPtr)0x0;
    }
    else {
      xmlBufSetAllocationScheme(pxStack_10->buffer,XML_BUFFER_ALLOC_DOUBLEIT);
      pxVar3 = xmlGetCharEncodingHandler(enc);
      pxStack_10->encoder = pxVar3;
      if (pxStack_10->encoder == (xmlCharEncodingHandlerPtr)0x0) {
        pxStack_10->raw = (xmlBufPtr)0x0;
      }
      else {
        piVar1 = __xmlDefaultBufferSize();
        pxVar2 = xmlBufCreateSize((long)(*piVar1 << 1));
        pxStack_10->raw = pxVar2;
      }
      pxStack_10->readcallback = (xmlInputReadCallback)0x0;
      pxStack_10->closecallback = (xmlInputCloseCallback)0x0;
      pxStack_10->context = (void *)0x0;
      pxStack_10->compressed = -1;
      pxStack_10->rawconsumed = 0;
    }
  }
  return pxStack_10;
}

Assistant:

xmlParserInputBufferPtr
xmlAllocParserInputBuffer(xmlCharEncoding enc) {
    xmlParserInputBufferPtr ret;

    ret = (xmlParserInputBufferPtr) xmlMalloc(sizeof(xmlParserInputBuffer));
    if (ret == NULL) {
	xmlIOErrMemory("creating input buffer");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlParserInputBuffer));
    ret->buffer = xmlBufCreateSize(2 * xmlDefaultBufferSize);
    if (ret->buffer == NULL) {
        xmlFree(ret);
	return(NULL);
    }
    xmlBufSetAllocationScheme(ret->buffer, XML_BUFFER_ALLOC_DOUBLEIT);
    ret->encoder = xmlGetCharEncodingHandler(enc);
    if (ret->encoder != NULL)
        ret->raw = xmlBufCreateSize(2 * xmlDefaultBufferSize);
    else
        ret->raw = NULL;
    ret->readcallback = NULL;
    ret->closecallback = NULL;
    ret->context = NULL;
    ret->compressed = -1;
    ret->rawconsumed = 0;

    return(ret);
}